

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::push_back(InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
            *this,rvalue_reference v)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  void *pvVar5;
  Rep *pRVar6;
  long lVar7;
  Rep *__s;
  ulong uVar8;
  Rep *__s_00;
  
  uVar2 = (this->allocator_and_tag_).tag_.size_;
  uVar8 = uVar2 >> 1;
  if ((uVar2 & 1) == 0) {
    uVar4 = 2;
  }
  else {
    uVar4 = *(ulong *)&this->rep_;
  }
  __s_00 = &this->rep_;
  if (uVar8 <= uVar4) {
    if (uVar8 == uVar4) {
      if (0x7ffffffffffffff < uVar2) {
        if (uVar2 >> 0x3c != 0) {
          std::__throw_bad_array_new_length();
        }
        std::__throw_bad_alloc();
      }
      pvVar5 = operator_new(uVar8 << 5);
      uVar3 = *(undefined8 *)&v->outgoing;
      puVar1 = (undefined8 *)((long)pvVar5 + uVar8 * 0x10);
      *puVar1 = *(undefined8 *)v;
      puVar1[1] = uVar3;
      uVar4 = (this->allocator_and_tag_).tag_.size_;
      __s = *(Rep **)((long)&this->rep_ + 8);
      pRVar6 = __s;
      if ((uVar4 & 1) == 0) {
        pRVar6 = __s_00;
      }
      for (lVar7 = 0; uVar8 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
        uVar3 = ((undefined8 *)((long)pRVar6 + lVar7))[1];
        *(undefined8 *)((long)pvVar5 + lVar7) = *(undefined8 *)((long)pRVar6 + lVar7);
        ((undefined8 *)((long)pvVar5 + lVar7))[1] = uVar3;
      }
      if ((uVar4 & 1) == 0) {
        if (uVar4 != 0) {
          memset(__s_00,0xab,uVar4 << 3);
        }
      }
      else {
        if (1 < uVar4) {
          memset(__s,0xab,(uVar4 & 0x1ffffffffffffffe) << 3);
          __s = *(Rep **)((long)&this->rep_ + 8);
          if (__s_00 != __s && ((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
            __assert_fail("begin() == allocated_space()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                          ,0x31b,
                          "void absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::ResetAllocation(Allocation, size_type) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>]"
                         );
          }
        }
        operator_delete(__s);
      }
      *(ulong *)&this->rep_ = uVar2 & 0x7fffffffffffffe;
      *(void **)((long)&this->rep_ + 8) = pvVar5;
      (this->allocator_and_tag_).tag_.size_ = (uVar2 | 1) + 2;
    }
    else {
      if (uVar4 <= uVar8) {
        __assert_fail("s < capacity()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                      ,0x21b,
                      "reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::emplace_back(Args &&...) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>, Args = <(anonymous namespace)::CrossingGraphEdge>]"
                     );
      }
      if ((uVar2 & 1) != 0) {
        __s_00 = *(Rep **)((long)&this->rep_ + 8);
      }
      (this->allocator_and_tag_).tag_.size_ = uVar2 + 2;
      uVar3 = *(undefined8 *)&v->outgoing;
      puVar1 = (undefined8 *)((long)__s_00 + uVar8 * 0x10);
      *puVar1 = *(undefined8 *)v;
      puVar1[1] = uVar3;
    }
    return;
  }
  __assert_fail("s <= capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x217,
                "reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::emplace_back(Args &&...) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>, Args = <(anonymous namespace)::CrossingGraphEdge>]"
               );
}

Assistant:

void push_back(rvalue_reference v) {
    static_cast<void>(emplace_back(std::move(v)));
  }